

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O1

int bt_plane_clip_polygon
              (cbtVector4 *plane,cbtVector3 *polygon_points,int polygon_point_count,
              cbtVector3 *clipped)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(polygon_points->m_floats[1] *
                                          (plane->super_cbtVector3).m_floats[1])),
                            ZEXT416((uint)polygon_points->m_floats[0]),
                            ZEXT416((uint)(plane->super_cbtVector3).m_floats[0]));
  auVar13 = vfmadd132ss_fma(ZEXT416((uint)polygon_points->m_floats[2]),auVar13,
                            ZEXT416((uint)(plane->super_cbtVector3).m_floats[2]));
  fVar4 = auVar13._0_4_ - (plane->super_cbtVector3).m_floats[3];
  if (fVar4 <= 1.1920929e-07) {
    uVar7 = *(undefined8 *)(polygon_points->m_floats + 2);
    *(undefined8 *)clipped->m_floats = *(undefined8 *)polygon_points->m_floats;
    *(undefined8 *)(clipped->m_floats + 2) = uVar7;
  }
  uVar9 = (uint)(fVar4 <= 1.1920929e-07);
  auVar11 = ZEXT416((uint)fVar4);
  auVar13 = auVar11;
  if (1 < polygon_point_count) {
    lVar10 = 0x10;
    auVar15 = auVar11;
    do {
      fVar2 = *(float *)((long)polygon_points->m_floats + lVar10);
      fVar12 = *(float *)((long)polygon_points->m_floats + lVar10 + 4);
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * (plane->super_cbtVector3).m_floats[1])),
                                ZEXT416((uint)fVar2),
                                ZEXT416((uint)(plane->super_cbtVector3).m_floats[0]));
      fVar3 = *(float *)((long)polygon_points->m_floats + lVar10 + 8);
      auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar3),
                                ZEXT416((uint)(plane->super_cbtVector3).m_floats[2]));
      fVar5 = auVar13._0_4_ - (plane->super_cbtVector3).m_floats[3];
      auVar13 = ZEXT416((uint)fVar5);
      uVar7 = vcmpps_avx512vl(SUB6416(ZEXT464(0x34000000),0),ZEXT416((uint)fVar5),1);
      uVar8 = vcmpps_avx512vl(SUB6416(ZEXT464(0x34000000),0),auVar15,5);
      if ((((ushort)uVar8 ^ (ushort)uVar7) & 1) == 0) {
        fVar14 = -auVar15._0_4_ / (fVar5 - auVar15._0_4_);
        fVar6 = 1.0 - fVar14;
        auVar15 = vinsertps_avx(ZEXT416((uint)(fVar6 * *(float *)((long)polygon_points[-1].m_floats
                                                                 + lVar10) + fVar2 * fVar14)),
                                ZEXT416((uint)(fVar12 * fVar14 +
                                              fVar6 * *(float *)((long)polygon_points->m_floats +
                                                                lVar10 + -0xc))),0x10);
        auVar15 = vinsertps_avx(auVar15,ZEXT416((uint)(fVar6 * *(float *)((long)polygon_points->
                                                                                m_floats +
                                                                         lVar10 + -8) +
                                                      fVar3 * fVar14)),0x28);
        *(undefined1 (*) [16])clipped[(int)uVar9].m_floats = auVar15;
        uVar9 = uVar9 + 1;
      }
      if (fVar5 <= 1.1920929e-07) {
        puVar1 = (undefined8 *)((long)polygon_points->m_floats + lVar10);
        uVar7 = puVar1[1];
        *(undefined8 *)clipped[(int)uVar9].m_floats = *puVar1;
        *(undefined8 *)(clipped[(int)uVar9].m_floats + 2) = uVar7;
        uVar9 = uVar9 + 1;
      }
      lVar10 = lVar10 + 0x10;
      auVar15 = ZEXT416((uint)fVar5);
    } while ((ulong)(uint)polygon_point_count << 4 != lVar10);
  }
  uVar7 = vcmpps_avx512vl(SUB6416(ZEXT464(0x34000000),0),auVar13,5);
  uVar8 = vcmpps_avx512vl(SUB6416(ZEXT464(0x34000000),0),auVar11,1);
  if ((((ushort)uVar8 ^ (ushort)uVar7) & 1) == 0) {
    auVar11._8_4_ = 0x80000000;
    auVar11._0_8_ = 0x8000000080000000;
    auVar11._12_4_ = 0x80000000;
    auVar11 = vxorps_avx512vl(auVar13,auVar11);
    fVar12 = auVar11._0_4_ / (fVar4 - auVar13._0_4_);
    fVar2 = 1.0 - fVar12;
    auVar13 = vinsertps_avx(ZEXT416((uint)(fVar2 * polygon_points[(long)polygon_point_count + -1].
                                                   m_floats[0] +
                                          fVar12 * polygon_points->m_floats[0])),
                            ZEXT416((uint)(fVar2 * polygon_points[(long)polygon_point_count + -1].
                                                   m_floats[1] +
                                          fVar12 * polygon_points->m_floats[1])),0x10);
    auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)(fVar2 * polygon_points
                                                           [(long)polygon_point_count + -1].m_floats
                                                           [2] +
                                                  fVar12 * polygon_points->m_floats[2])),0x28);
    *(undefined1 (*) [16])clipped[(int)uVar9].m_floats = auVar13;
    uVar9 = uVar9 + 1;
  }
  if (fVar4 <= 1.1920929e-07) {
    uVar7 = *(undefined8 *)(polygon_points->m_floats + 2);
    *(undefined8 *)clipped[(int)uVar9].m_floats = *(undefined8 *)polygon_points->m_floats;
    *(undefined8 *)(clipped[(int)uVar9].m_floats + 2) = uVar7;
    uVar9 = uVar9 + 1;
  }
  return uVar9;
}

Assistant:

SIMD_FORCE_INLINE cbtScalar dot(const cbtVector3& v) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)
		__m128 vd = _mm_mul_ps(mVec128, v.mVec128);
		__m128 z = _mm_movehl_ps(vd, vd);
		__m128 y = _mm_shuffle_ps(vd, vd, 0x55);
		vd = _mm_add_ss(vd, y);
		vd = _mm_add_ss(vd, z);
		return _mm_cvtss_f32(vd);
#elif defined(BT_USE_NEON)
		float32x4_t vd = vmulq_f32(mVec128, v.mVec128);
		float32x2_t x = vpadd_f32(vget_low_f32(vd), vget_low_f32(vd));
		x = vadd_f32(x, vget_high_f32(vd));
		return vget_lane_f32(x, 0);
#else
		return m_floats[0] * v.m_floats[0] +
			   m_floats[1] * v.m_floats[1] +
			   m_floats[2] * v.m_floats[2];
#endif
	}